

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist.cpp
# Opt level: O1

void InsertAfter(LinkedList *L,ElementType item)

{
  Node *pNVar1;
  
  if (L->size == 0) {
    pNVar1 = GetNode(item,(Node *)0x0);
    L->front = pNVar1;
    L->rear = pNVar1;
    L->position = 0;
  }
  else {
    pNVar1 = L->currPtr;
    if ((pNVar1 == (Node *)0x0) || (pNVar1 == L->rear)) {
      pNVar1 = GetNode(item,(Node *)0x0);
      InsertAfter(L->rear,pNVar1);
      L->prevPtr = L->rear;
      L->rear = pNVar1;
      L->position = L->size;
    }
    else {
      pNVar1 = GetNode(item,pNVar1->next);
      InsertAfter(L->currPtr,pNVar1);
      L->prevPtr = L->currPtr;
      L->position = L->position + 1;
    }
  }
  L->size = L->size + 1;
  L->currPtr = pNVar1;
  return;
}

Assistant:

void InsertAfter(LinkedList *L, ElementType item) {  //链表中在当前结点后插入新结点的函数
    Node *newNode;
    if(!L->size) {
        newNode = GetNode(item,NULL); //在空表中插入
        L->front = newNode;
        L->rear = newNode;
        L->position = 0;
    } else if(!L->currPtr || L->currPtr==L->rear) {
        newNode = GetNode(item,NULL);  //在表头结点插入
        InsertAfter(L->rear,newNode);
        L->prevPtr = L->rear;
        L->rear = newNode;
        L->position = L->size;
    } else {
        newNode = GetNode(item,(L->currPtr)->next);  //在链表中间插入
        InsertAfter(L->currPtr,newNode);
        L->prevPtr = L->currPtr;
        L->position++;
    }
    L->size++;   //增加链表的大小
    L->currPtr = newNode;   //新插入的结点作为当前结点
}